

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void ecs_init_system(ecs_world_t *world,ecs_entity_t system,ecs_iter_action_t action,
                    ecs_query_t *query,void *ctx)

{
  int32_t *piVar1;
  ecs_query_t *peVar2;
  _Bool _Var3;
  int32_t iVar4;
  uint uVar5;
  EcsSystem *pEVar6;
  void *pvVar7;
  ecs_on_demand_out_t *peVar8;
  ecs_on_demand_in_t *peVar9;
  long *plVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  _Bool is_added;
  _Bool local_51;
  EcsSystem *local_50;
  ecs_entity_t local_48;
  ecs_query_t *local_40;
  long local_38;
  
  _ecs_assert((_Bool)(world->in_progress ^ 1),0x19,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0xe8);
  if (world->in_progress == true) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0xe8,
                  "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                 );
  }
  local_51 = false;
  pEVar6 = (EcsSystem *)ecs_get_mut_w_entity(world,system,5,&local_51);
  _ecs_assert(pEVar6 != (EcsSystem *)0x0,0xc,(char *)0x0,"sptr != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
              ,0xed);
  local_50 = pEVar6;
  if (pEVar6 == (EcsSystem *)0x0) {
    __assert_fail("sptr != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0xed,
                  "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                 );
  }
  if (local_51 == false) {
    _ecs_assert(pEVar6->query == query,2,(char *)0x0,"sptr->query == query",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                ,0xf0);
    if (pEVar6->query != query) {
      __assert_fail("sptr->query == query",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                    ,0xf0,
                    "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                   );
    }
  }
  else {
    pEVar6->entity = 0;
    pEVar6->query = (ecs_query_t *)0x0;
    pEVar6->status_ctx = (void *)0x0;
    pEVar6->tick_source = 0;
    pEVar6->invoke_count = 0;
    pEVar6->time_spent = 0.0;
    *(undefined8 *)&pEVar6->time_passed = 0;
    pEVar6->on_demand = (ecs_on_demand_out_t *)0x0;
    pEVar6->status_action = (ecs_system_status_action_t)0x0;
    pEVar6->action = (ecs_iter_action_t)0x0;
    pEVar6->ctx = (void *)0x0;
    pEVar6->query = query;
    pEVar6->entity = system;
    pEVar6->tick_source = 0;
    pEVar6->time_spent = 0.0;
  }
  pEVar6->action = action;
  pEVar6->ctx = ctx;
  if (local_51 == true) {
    iVar4 = ecs_vector_count(query->tables);
    if (iVar4 == 0) {
      ecs_add_entity(world,system,0x105);
    }
    else {
      ecs_system_activate(world,system,true,local_50);
    }
    activate_in_columns(world,query,world->on_enable_components,true);
    _Var3 = ecs_sig_check_constraints(world,&query->sig);
    if (!_Var3) {
      ecs_add_entity(world,system,0x104);
    }
    _Var3 = ecs_has_entity(world,system,0x106);
    pEVar6 = local_50;
    if (_Var3) {
      peVar2 = local_50->query;
      local_48 = system;
      local_40 = query;
      pvVar7 = _ecs_vector_first((peVar2->sig).columns,0x28,0x10);
      uVar5 = ecs_vector_count((peVar2->sig).columns);
      if ((int)uVar5 < 1) {
        pcVar12 = ecs_get_name(world,local_48);
        _ecs_assert(false,0x24,pcVar12,"out_count != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                    ,0x8d);
LAB_0013148a:
        __assert_fail("out_count != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x8d,"void register_out_columns(ecs_world_t *, ecs_entity_t, EcsSystem *)");
      }
      lVar11 = (ulong)uVar5 * 0x28;
      lVar14 = 0;
      iVar13 = 0;
      local_38 = lVar11;
      do {
        if (*(int *)((long)pvVar7 + lVar14 + 8) == 2) {
          if (pEVar6->on_demand == (ecs_on_demand_out_t *)0x0) {
            peVar8 = (ecs_on_demand_out_t *)(*ecs_os_api.malloc_)(0x10);
            pEVar6->on_demand = peVar8;
            _ecs_assert(peVar8 != (ecs_on_demand_out_t *)0x0,0x11,(char *)0x0,
                        "system_data->on_demand != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                        ,0x6f);
            peVar8 = pEVar6->on_demand;
            if (peVar8 == (ecs_on_demand_out_t *)0x0) {
              __assert_fail("system_data->on_demand != ((void*)0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                            ,0x6f,
                            "void register_out_columns(ecs_world_t *, ecs_entity_t, EcsSystem *)");
            }
            peVar8->system = local_48;
            peVar8->count = 0;
          }
          peVar8 = pEVar6->on_demand;
          peVar9 = get_in_component((&world->on_activate_components)
                                    [*(int *)((long)pvVar7 + lVar14 + 4) == 2],
                                    *(ecs_entity_t *)((long)pvVar7 + lVar14 + 0x10));
          _ecs_assert(true,0xc,(char *)0x0,"in != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x5a);
          pEVar6 = local_50;
          piVar1 = &peVar8->count;
          *piVar1 = *piVar1 + peVar9->count;
          plVar10 = (long *)_ecs_vector_add(&peVar9->systems,8,0x10);
          *plVar10 = (long)peVar8;
          iVar13 = iVar13 + 1;
          lVar11 = local_38;
        }
        system = local_48;
        lVar14 = lVar14 + 0x28;
      } while (lVar11 != lVar14);
      pcVar12 = ecs_get_name(world,local_48);
      _ecs_assert(iVar13 != 0,0x24,pcVar12,"out_count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x8d);
      if (iVar13 == 0) goto LAB_0013148a;
      _ecs_assert(pEVar6->on_demand != (ecs_on_demand_out_t *)0x0,0xc,(char *)0x0,
                  "sptr->on_demand != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                  ,0x118);
      query = local_40;
      if (pEVar6->on_demand == (ecs_on_demand_out_t *)0x0) {
        __assert_fail("sptr->on_demand != ((void*)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
                      ,0x118,
                      "void ecs_init_system(ecs_world_t *, ecs_entity_t, ecs_iter_action_t, ecs_query_t *, void *)"
                     );
      }
      if (pEVar6->on_demand->count == 0) {
        ecs_add_entity(world,system,0x104);
      }
    }
    ecs_vector_count((query->sig).columns);
    _ecs_vector_first((query->sig).columns,0x28,0x10);
  }
  pcVar12 = ecs_get_name(world,system);
  _ecs_trace(1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/modules/system/system.c"
             ,0x12e,"system #[green]%s#[reset] created with #[red]%s",pcVar12,(query->sig).expr);
  return;
}

Assistant:

static
void ecs_init_system(
    ecs_world_t *world,
    ecs_entity_t system,
    ecs_iter_action_t action,
    ecs_query_t *query,
    void *ctx)
{
    ecs_assert(!world->in_progress, ECS_INVALID_WHILE_ITERATING, NULL);

    /* Add & initialize the EcsSystem component */
    bool is_added = false;
    EcsSystem *sptr = ecs_get_mut(world, system, EcsSystem, &is_added);
    ecs_assert(sptr != NULL, ECS_INTERNAL_ERROR, NULL);

    if (!is_added) {
        ecs_assert(sptr->query == query, ECS_INVALID_PARAMETER, NULL);
    } else {
        memset(sptr, 0, sizeof(EcsSystem));
        sptr->query = query;
        sptr->entity = system;
        sptr->tick_source = 0;
        sptr->time_spent = 0;
    }

    /* Sanity check to make sure creating the query didn't add any additional
     * tags or components to the system */
    sptr->action = action;
    sptr->ctx = ctx;

    /* Only run this code when the system is created for the first time */
    if (is_added) {
        /* If tables have been matched with this system it is active, and we
         * should activate the in-columns, if any. This will ensure that any
         * OnDemand systems get enabled. */
        if (ecs_vector_count(query->tables)) {
            ecs_system_activate(world, system, true, sptr);
        } else {
            /* If system isn't matched with any tables, mark it as inactive. This
             * causes it to be ignored by the main loop. When the system matches
             * with a table it will be activated. */
            ecs_add_entity(world, system, EcsInactive);
        }

        /* If system is enabled, trigger enable components */
        activate_in_columns(world, query, world->on_enable_components, true);

        /* Check if all non-table column constraints are met. If not, disable
         * system (system will be enabled once constraints are met) */
        if (!ecs_sig_check_constraints(world, &query->sig)) {
            ecs_add_entity(world, system, EcsDisabledIntern);
        }

        /* If the query has a OnDemand system tag, register its [out] columns */
        if (ecs_has_entity(world, system, EcsOnDemand)) {
            register_out_columns(world, system, sptr);
            ecs_assert(sptr->on_demand != NULL, ECS_INTERNAL_ERROR, NULL);

            /* If there are no systems currently interested in any of the [out]
             * columns of the on demand system, disable it */
            if (!sptr->on_demand->count) {
                ecs_add_entity(world, system, EcsDisabledIntern);
            }        
        }

        /* Check if system has out columns */
        int32_t i, count = ecs_vector_count(query->sig.columns);
        ecs_sig_column_t *columns = ecs_vector_first(
                query->sig.columns, ecs_sig_column_t);
        
        for (i = 0; i < count; i ++) {
            if (columns[i].inout_kind != EcsIn) {
                break;
            }
        }
    }

    ecs_trace_1("system #[green]%s#[reset] created with #[red]%s", 
        ecs_get_name(world, system), query->sig.expr);
}